

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# operand.cpp
# Opt level: O1

function<bool_(unsigned_int)> *
spvOperandCanBeForwardDeclaredFunction
          (function<bool_(unsigned_int)> *__return_storage_ptr__,Op opcode)

{
  int32_t iVar1;
  ulong uVar2;
  code *pcVar3;
  code *pcVar4;
  undefined4 in_register_00000034;
  anon_class_1_0_00000001 *__f;
  uint uVar5;
  _Any_data local_38;
  _Manager_type local_28;
  _Invoker_type local_20;
  
  __f = (anon_class_1_0_00000001 *)CONCAT44(in_register_00000034,opcode);
  (__return_storage_ptr__->super__Function_base)._M_manager = (_Manager_type)0x0;
  __return_storage_ptr__->_M_invoker = (_Invoker_type)0x0;
  *(undefined8 *)&(__return_storage_ptr__->super__Function_base)._M_functor = 0;
  *(undefined8 *)((long)&(__return_storage_ptr__->super__Function_base)._M_functor + 8) = 0;
  iVar1 = spvOpcodeGeneratesType(opcode);
  if (iVar1 != 0) {
    pcVar3 = std::
             _Function_handler<bool_(unsigned_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/operand.cpp:525:11)>
             ::_M_invoke;
    pcVar4 = std::
             _Function_handler<bool_(unsigned_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/operand.cpp:525:11)>
             ::_M_manager;
    local_38._M_unused._0_8_ =
         (undefined8)*(undefined8 *)&(__return_storage_ptr__->super__Function_base)._M_functor;
    local_38._8_8_ =
         *(undefined8 *)((long)&(__return_storage_ptr__->super__Function_base)._M_functor + 8);
    *(undefined8 *)&(__return_storage_ptr__->super__Function_base)._M_functor = 0;
    *(undefined8 *)((long)&(__return_storage_ptr__->super__Function_base)._M_functor + 8) = 0;
    goto LAB_0029bc8e;
  }
  if ((int)opcode < 0xf9) {
    if ((int)opcode < 0x47) {
      if (0x1b < (int)opcode) {
        if (opcode == OpTypeArray) {
          std::function<bool(unsigned_int)>::operator=
                    ((function<bool(unsigned_int)> *)__return_storage_ptr__,__f);
          return __return_storage_ptr__;
        }
        if (opcode == OpTypeForwardPointer) {
          std::function<bool(unsigned_int)>::operator=
                    ((function<bool(unsigned_int)> *)__return_storage_ptr__,__f);
          return __return_storage_ptr__;
        }
        if (opcode == OpFunctionCall) {
          std::function<bool(unsigned_int)>::operator=
                    ((function<bool(unsigned_int)> *)__return_storage_ptr__,__f);
          return __return_storage_ptr__;
        }
        goto LAB_0029bd24;
      }
      if (1 < opcode - OpName) {
        uVar5 = opcode - OpEntryPoint;
        goto LAB_0029bbaa;
      }
    }
    else if ((int)opcode < 0xf5) {
      if (1 < opcode - OpDecorate) {
        if (1 < opcode - OpGroupDecorate) goto LAB_0029bd24;
        goto LAB_0029bc11;
      }
    }
    else if (1 < opcode - OpLoopMerge) {
      if (opcode == OpPhi) {
        std::function<bool(unsigned_int)>::operator=
                  ((function<bool(unsigned_int)> *)__return_storage_ptr__,__f);
        return __return_storage_ptr__;
      }
      goto LAB_0029bd24;
    }
LAB_0029bc65:
    pcVar3 = std::
             _Function_handler<bool_(unsigned_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/operand.cpp:542:13)>
             ::_M_invoke;
    pcVar4 = std::
             _Function_handler<bool_(unsigned_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/operand.cpp:542:13)>
             ::_M_manager;
  }
  else if ((int)opcode < 0x125) {
    if (1 < opcode - OpBranchConditional) {
      if (opcode != OpBranch) {
        if (opcode == OpEnqueueKernel) {
          std::function<bool(unsigned_int)>::operator=
                    ((function<bool(unsigned_int)> *)__return_storage_ptr__,__f);
          return __return_storage_ptr__;
        }
        goto LAB_0029bd24;
      }
      goto LAB_0029bc65;
    }
LAB_0029bc11:
    pcVar3 = std::
             _Function_handler<bool_(unsigned_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/operand.cpp:548:13)>
             ::_M_invoke;
    pcVar4 = std::
             _Function_handler<bool_(unsigned_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/operand.cpp:548:13)>
             ::_M_manager;
  }
  else {
    uVar2 = (ulong)(opcode - OpGetKernelNDrangeSubGroupCount);
    if (0x27 < opcode - OpGetKernelNDrangeSubGroupCount) {
LAB_0029bba3:
      uVar5 = opcode - OpDecorateString;
LAB_0029bbaa:
      if (1 < uVar5) {
LAB_0029bd24:
        std::function<bool(unsigned_int)>::operator=
                  ((function<bool(unsigned_int)> *)__return_storage_ptr__,__f);
        return __return_storage_ptr__;
      }
      goto LAB_0029bc65;
    }
    if ((3UL >> (uVar2 & 0x3f) & 1) == 0) {
      if ((0xcUL >> (uVar2 & 0x3f) & 1) == 0) {
        if ((0xc000000000U >> (uVar2 & 0x3f) & 1) != 0) goto LAB_0029bc65;
        goto LAB_0029bba3;
      }
      pcVar3 = std::
               _Function_handler<bool_(unsigned_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/operand.cpp:574:13)>
               ::_M_invoke;
      pcVar4 = std::
               _Function_handler<bool_(unsigned_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/operand.cpp:574:13)>
               ::_M_manager;
    }
    else {
      pcVar3 = std::
               _Function_handler<bool_(unsigned_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/operand.cpp:568:13)>
               ::_M_invoke;
      pcVar4 = std::
               _Function_handler<bool_(unsigned_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/operand.cpp:568:13)>
               ::_M_manager;
    }
  }
  local_38._M_unused._0_8_ =
       (undefined8)*(undefined8 *)&(__return_storage_ptr__->super__Function_base)._M_functor;
  local_38._8_8_ =
       *(undefined8 *)((long)&(__return_storage_ptr__->super__Function_base)._M_functor + 8);
  *(undefined8 *)&(__return_storage_ptr__->super__Function_base)._M_functor = 0;
  *(undefined8 *)((long)&(__return_storage_ptr__->super__Function_base)._M_functor + 8) = 0;
LAB_0029bc8e:
  local_28 = (__return_storage_ptr__->super__Function_base)._M_manager;
  (__return_storage_ptr__->super__Function_base)._M_manager = pcVar4;
  local_20 = __return_storage_ptr__->_M_invoker;
  __return_storage_ptr__->_M_invoker = pcVar3;
  if (local_28 != (_Manager_type)0x0) {
    (*local_28)(&local_38,&local_38,__destroy_functor);
  }
  return __return_storage_ptr__;
}

Assistant:

std::function<bool(unsigned)> spvOperandCanBeForwardDeclaredFunction(
    spv::Op opcode) {
  std::function<bool(unsigned index)> out;
  if (spvOpcodeGeneratesType(opcode)) {
    // All types can use forward pointers.
    out = [](unsigned) { return true; };
    return out;
  }
  switch (opcode) {
    case spv::Op::OpExecutionMode:
    case spv::Op::OpExecutionModeId:
    case spv::Op::OpEntryPoint:
    case spv::Op::OpName:
    case spv::Op::OpMemberName:
    case spv::Op::OpSelectionMerge:
    case spv::Op::OpDecorate:
    case spv::Op::OpMemberDecorate:
    case spv::Op::OpDecorateId:
    case spv::Op::OpDecorateStringGOOGLE:
    case spv::Op::OpMemberDecorateStringGOOGLE:
    case spv::Op::OpBranch:
    case spv::Op::OpLoopMerge:
      out = [](unsigned) { return true; };
      break;
    case spv::Op::OpGroupDecorate:
    case spv::Op::OpGroupMemberDecorate:
    case spv::Op::OpBranchConditional:
    case spv::Op::OpSwitch:
      out = [](unsigned index) { return index != 0; };
      break;

    case spv::Op::OpFunctionCall:
      // The Function parameter.
      out = [](unsigned index) { return index == 2; };
      break;

    case spv::Op::OpPhi:
      out = [](unsigned index) { return index > 1; };
      break;

    case spv::Op::OpEnqueueKernel:
      // The Invoke parameter.
      out = [](unsigned index) { return index == 8; };
      break;

    case spv::Op::OpGetKernelNDrangeSubGroupCount:
    case spv::Op::OpGetKernelNDrangeMaxSubGroupSize:
      // The Invoke parameter.
      out = [](unsigned index) { return index == 3; };
      break;

    case spv::Op::OpGetKernelWorkGroupSize:
    case spv::Op::OpGetKernelPreferredWorkGroupSizeMultiple:
      // The Invoke parameter.
      out = [](unsigned index) { return index == 2; };
      break;
    case spv::Op::OpTypeForwardPointer:
      out = [](unsigned index) { return index == 0; };
      break;
    case spv::Op::OpTypeArray:
      out = [](unsigned index) { return index == 1; };
      break;
    default:
      out = [](unsigned) { return false; };
      break;
  }
  return out;
}